

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O2

SUNAdaptController SUNAdaptController_Soderlind(SUNContext_conflict sunctx)

{
  SUNAdaptController_Ops p_Var1;
  SUNAdaptController C;
  void *pvVar2;
  
  C = (SUNAdaptController)SUNAdaptController_NewEmpty();
  p_Var1 = C->ops;
  p_Var1->gettype = SUNAdaptController_GetType_Soderlind;
  p_Var1->estimatestep = SUNAdaptController_EstimateStep_Soderlind;
  p_Var1->reset = SUNAdaptController_Reset_Soderlind;
  p_Var1->setdefaults = SUNAdaptController_SetDefaults_Soderlind;
  p_Var1->write = SUNAdaptController_Write_Soderlind;
  p_Var1->seterrorbias = SUNAdaptController_SetErrorBias_Soderlind;
  p_Var1->updateh = SUNAdaptController_UpdateH_Soderlind;
  p_Var1->space = SUNAdaptController_Space_Soderlind;
  pvVar2 = malloc(0x58);
  C->content = pvVar2;
  SUNAdaptController_SetDefaults_Soderlind(C);
  pvVar2 = C->content;
  *(undefined8 *)((long)pvVar2 + 0x30) = 0x3ff0000000000000;
  *(undefined8 *)((long)pvVar2 + 0x38) = 0x3ff0000000000000;
  *(undefined8 *)((long)pvVar2 + 0x40) = 0x3ff0000000000000;
  *(undefined8 *)((long)pvVar2 + 0x48) = 0x3ff0000000000000;
  *(undefined4 *)((long)pvVar2 + 0x50) = 0;
  return C;
}

Assistant:

SUNAdaptController SUNAdaptController_Soderlind(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  /* Create an empty controller object */
  SUNAdaptController C = SUNAdaptController_NewEmpty(sunctx);
  SUNCheckLastErrNull();
  SUNAdaptControllerContent_Soderlind content = NULL;

  /* Attach operations */
  C->ops->gettype      = SUNAdaptController_GetType_Soderlind;
  C->ops->estimatestep = SUNAdaptController_EstimateStep_Soderlind;
  C->ops->reset        = SUNAdaptController_Reset_Soderlind;
  C->ops->setdefaults  = SUNAdaptController_SetDefaults_Soderlind;
  C->ops->write        = SUNAdaptController_Write_Soderlind;
  C->ops->seterrorbias = SUNAdaptController_SetErrorBias_Soderlind;
  C->ops->updateh      = SUNAdaptController_UpdateH_Soderlind;
  C->ops->space        = SUNAdaptController_Space_Soderlind;

  /* Create content */
  content = (SUNAdaptControllerContent_Soderlind)malloc(sizeof(*content));
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);
  C->content = content;

  /* Fill content with default/reset values */
  SUNCheckCallNull(SUNAdaptController_SetDefaults_Soderlind(C));
  SUNCheckCallNull(SUNAdaptController_Reset_Soderlind(C));

  return (C);
}